

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.hpp
# Opt level: O1

rt_expr<viennamath::rt_expression_interface<double>_> __thiscall
viennamath::substitute<viennamath::rt_expression_interface<double>>
          (viennamath *this,rt_variable<viennamath::rt_expression_interface<double>_> *u,
          default_numeric_type repl,rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  undefined4 extraout_var;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> c;
  undefined **local_20;
  default_numeric_type local_18;
  
  local_20 = &PTR__rt_expression_interface_00112718;
  prVar1 = (e->rt_expr_)._M_ptr;
  local_18 = repl;
  iVar2 = (*prVar1->_vptr_rt_expression_interface[0xe])(prVar1,u,&local_20);
  *(ulong *)this = CONCAT44(extraout_var,iVar2);
  inplace_simplify<viennamath::rt_expression_interface<double>>
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)this);
  return (rt_expr<viennamath::rt_expression_interface<double>_>)
         (auto_ptr<const_viennamath::rt_expression_interface<double>_>)this;
}

Assistant:

rt_expr<InterfaceType> substitute(rt_variable<InterfaceType> const & u,
                                    default_numeric_type repl,
                                    rt_expr<InterfaceType> const & e)
  {
    rt_constant<default_numeric_type, InterfaceType> c(repl);
    rt_expr<InterfaceType> temp(e.get()->substitute(&u, &c));
    inplace_simplify(temp);
    return temp;
  }